

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O3

void __thiscall
(anonymous_namespace)::ClCommandLine::add<char_const*,char_const*>
          (ClCommandLine *this,string *s,char *strs,char *strs_1)

{
  _Node *p_Var1;
  allocator local_41;
  string local_40;
  
  p_Var1 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
           _M_create_node<std::__cxx11::string_const&>
                     ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                      (this + 0x10),s);
  std::__detail::_List_node_base::_M_hook(&p_Var1->super__List_node_base);
  *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
  std::__cxx11::string::string((string *)&local_40,strs,&local_41);
  add<char_const*>(this,&local_40,strs_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void add (std::string const & s, Strs... strs) {
            strings_.push_back (s);
            this->add (strs...);
        }